

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O3

void Abc_NtkDelete(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  void **ppvVar3;
  int *piVar4;
  Mem_Step_t *pMVar5;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  long lVar13;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    return;
  }
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(pNtk->pExdc);
  }
  if ((Abc_Ntk_t *)pNtk->pExcare != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete((Abc_Ntk_t *)pNtk->pExcare);
  }
  pVVar7 = pNtk->vObjs;
  uVar8 = pVVar7->nSize;
  uVar9 = (ulong)uVar8;
  if (pNtk->ntkFunc == ABC_FUNC_BDD) {
    if (0 < (int)uVar8) {
      lVar13 = 0;
      do {
        pvVar2 = pVVar7->pArray[lVar13];
        if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) {
          Cudd_RecursiveDeref((DdManager *)pNtk->pManFunc,*(DdNode **)((long)pvVar2 + 0x38));
          pVVar7 = pNtk->vObjs;
        }
        lVar13 = lVar13 + 1;
        uVar9 = (ulong)pVVar7->nSize;
      } while (lVar13 < (long)uVar9);
      goto LAB_00868a68;
    }
  }
  else {
LAB_00868a68:
    uVar8 = (uint)uVar9;
    if (0 < (int)uVar8) {
      uVar10 = 0;
      do {
        if (pVVar7->pArray[uVar10] != (void *)0x0) {
          uVar1 = *(uint *)((long)pVVar7->pArray[uVar10] + 0x14);
          if ((uVar1 & 0x10) != 0) {
            __assert_fail("pObj->fMarkA == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                          ,0x521,"void Abc_NtkDelete(Abc_Ntk_t *)");
          }
          if ((uVar1 & 0x20) != 0) {
            __assert_fail("pObj->fMarkB == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                          ,0x522,"void Abc_NtkDelete(Abc_Ntk_t *)");
          }
          if ((uVar1 & 0x40) != 0) {
            __assert_fail("pObj->fMarkC == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                          ,0x523,"void Abc_NtkDelete(Abc_Ntk_t *)");
          }
        }
        uVar10 = uVar10 + 1;
      } while ((uVar9 & 0xffffffff) != uVar10);
    }
    if ((pNtk->pMmStep == (Mem_Step_t *)0x0) && (0 < (int)uVar8)) {
      lVar13 = 0;
      do {
        pvVar2 = pVVar7->pArray[lVar13];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 0x30) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 0x30));
            *(undefined8 *)((long)pvVar2 + 0x30) = 0;
          }
          if (*(void **)((long)pvVar2 + 0x20) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 0x20));
            *(undefined8 *)((long)pvVar2 + 0x20) = 0;
          }
        }
        lVar13 = lVar13 + 1;
        pVVar7 = pNtk->vObjs;
        uVar8 = pVVar7->nSize;
      } while (lVar13 < (int)uVar8);
    }
  }
  if ((pNtk->pMmObj == (Mem_Fixed_t *)0x0) && (0 < (int)uVar8)) {
    lVar13 = 0;
    do {
      if (pVVar7->pArray[lVar13] != (void *)0x0) {
        free(pVVar7->pArray[lVar13]);
        pVVar7 = pNtk->vObjs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar7->nSize);
  }
  pVVar7 = pNtk->vPios;
  ppvVar3 = pVVar7->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar7);
  pVVar7 = pNtk->vPis;
  ppvVar3 = pVVar7->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar7);
  pVVar7 = pNtk->vPos;
  ppvVar3 = pVVar7->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar7);
  pVVar7 = pNtk->vCis;
  ppvVar3 = pVVar7->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar7);
  pVVar7 = pNtk->vCos;
  ppvVar3 = pVVar7->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar7);
  pVVar7 = pNtk->vObjs;
  ppvVar3 = pVVar7->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar7);
  pVVar7 = pNtk->vBoxes;
  ppvVar3 = pVVar7->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar7);
  piVar4 = (pNtk->vTravIds).pArray;
  if (piVar4 != (int *)0x0) {
    free(piVar4);
    (pNtk->vTravIds).pArray = (int *)0x0;
  }
  pVVar11 = pNtk->vLevelsR;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
    }
    free(pVVar11);
  }
  if (pNtk->pModel != (int *)0x0) {
    free(pNtk->pModel);
    pNtk->pModel = (int *)0x0;
  }
  if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
    free(pNtk->pSeqModel);
    pNtk->pSeqModel = (Abc_Cex_t *)0x0;
  }
  pVVar7 = pNtk->vSeqModelVec;
  if (pVVar7 != (Vec_Ptr_t *)0x0) {
    iVar6 = pVVar7->nSize;
    if (0 < iVar6) {
      lVar13 = 0;
      do {
        if ((void *)0x2 < pVVar7->pArray[lVar13]) {
          free(pVVar7->pArray[lVar13]);
          iVar6 = pVVar7->nSize;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < iVar6);
    }
    if (pVVar7->pArray != (void **)0x0) {
      free(pVVar7->pArray);
    }
    free(pVVar7);
  }
  if (pNtk->pMmObj != (Mem_Fixed_t *)0x0) {
    Mem_FixedReadMemUsage(pNtk->pMmObj);
  }
  pMVar5 = pNtk->pMmStep;
  if (pMVar5 != (Mem_Step_t *)0x0) {
    Mem_StepReadMemUsage(pMVar5);
  }
  if (pNtk->pMmObj != (Mem_Fixed_t *)0x0) {
    Mem_FixedStop(pNtk->pMmObj,0);
  }
  pMVar5 = pNtk->pMmStep;
  if (pMVar5 != (Mem_Step_t *)0x0) {
    Mem_StepStop(pMVar5,0);
  }
  Nm_ManFree(pNtk->pManName);
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    Abc_ManTimeStop(pNtk->pManTime);
  }
  pVVar11 = pNtk->vPhases;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
      pNtk->vPhases->pArray = (int *)0x0;
      pVVar11 = pNtk->vPhases;
      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_00868d73;
    }
    free(pVVar11);
    pNtk->vPhases = (Vec_Int_t *)0x0;
  }
LAB_00868d73:
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    Abc_AigFree((Abc_Aig_t *)pNtk->pManFunc);
  }
  else {
    switch(pNtk->ntkFunc) {
    case ABC_FUNC_SOP:
    case ABC_FUNC_BLIFMV:
      Mem_FlexStop((Mem_Flex_t *)pNtk->pManFunc,0);
      break;
    case ABC_FUNC_BDD:
      Extra_StopManager((DdManager *)pNtk->pManFunc);
      break;
    case ABC_FUNC_AIG:
      if ((Hop_Man_t *)pNtk->pManFunc != (Hop_Man_t *)0x0) {
        Hop_ManStop((Hop_Man_t *)pNtk->pManFunc);
      }
      break;
    case ABC_FUNC_MAP:
      pNtk->pManFunc = (void *)0x0;
      break;
    case ABC_FUNC_BLACKBOX:
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x55f,"void Abc_NtkDelete(Abc_Ntk_t *)");
    }
  }
  if (pNtk->pDesign != (Abc_Des_t *)0x0) {
    Abc_DesFree(pNtk->pDesign,pNtk);
    pNtk->pDesign = (Abc_Des_t *)0x0;
  }
  pVVar7 = pNtk->vAttrs;
  if (0 < pVVar7->nSize) {
    lVar13 = 0;
    do {
      piVar4 = (int *)pVVar7->pArray[lVar13];
      if (piVar4 != (int *)0x0) {
        if ((*(long *)(piVar4 + 10) != 0) && (iVar6 = *piVar4, 0 < iVar6)) {
          lVar12 = 0;
          do {
            if (*(long *)(*(long *)(piVar4 + 2) + lVar12 * 8) != 0) {
              (**(code **)(piVar4 + 10))(*(undefined8 *)(piVar4 + 4));
              iVar6 = *piVar4;
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < iVar6);
        }
        if (*(long *)(piVar4 + 4) != 0) {
          (**(code **)(piVar4 + 6))();
        }
        if (*(void **)(piVar4 + 2) != (void *)0x0) {
          free(*(void **)(piVar4 + 2));
        }
        free(piVar4);
        pVVar7 = pNtk->vAttrs;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar7->nSize);
  }
  if (pNtk->pSCLib != (void *)0x0) {
    __assert_fail("pNtk->pSCLib == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                  ,0x56c,"void Abc_NtkDelete(Abc_Ntk_t *)");
  }
  pVVar11 = pNtk->vGates;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
      pNtk->vGates->pArray = (int *)0x0;
      pVVar11 = pNtk->vGates;
      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_00868edc;
    }
    free(pVVar11);
    pNtk->vGates = (Vec_Int_t *)0x0;
  }
LAB_00868edc:
  pVVar7 = pNtk->vAttrs;
  ppvVar3 = pVVar7->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar7);
  pVVar11 = pNtk->vNameIds;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
      pNtk->vNameIds->pArray = (int *)0x0;
      pVVar11 = pNtk->vNameIds;
      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_00868f41;
    }
    free(pVVar11);
    pNtk->vNameIds = (Vec_Int_t *)0x0;
  }
LAB_00868f41:
  if (pNtk->pWLoadUsed != (char *)0x0) {
    free(pNtk->pWLoadUsed);
    pNtk->pWLoadUsed = (char *)0x0;
  }
  if (pNtk->pName != (char *)0x0) {
    free(pNtk->pName);
    pNtk->pName = (char *)0x0;
  }
  if (pNtk->pSpec != (char *)0x0) {
    free(pNtk->pSpec);
    pNtk->pSpec = (char *)0x0;
  }
  if (pNtk->pLutTimes != (float *)0x0) {
    free(pNtk->pLutTimes);
    pNtk->pLutTimes = (float *)0x0;
  }
  pVVar7 = pNtk->vOnehots;
  if (pVVar7 != (Vec_Ptr_t *)0x0) {
    iVar6 = pVVar7->nSize;
    if (0 < iVar6) {
      lVar13 = 0;
      do {
        pvVar2 = pVVar7->pArray[lVar13];
        if (pvVar2 != (void *)0x0) {
          if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 8));
          }
          free(pvVar2);
          iVar6 = pVVar7->nSize;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < iVar6);
    }
    if (pVVar7->pArray != (void **)0x0) {
      free(pVVar7->pArray);
    }
    free(pVVar7);
  }
  pVVar7 = pNtk->vLtlProperties;
  if (pVVar7 != (Vec_Ptr_t *)0x0) {
    if (pVVar7->pArray != (void **)0x0) {
      free(pVVar7->pArray);
      pNtk->vLtlProperties->pArray = (void **)0x0;
      pVVar7 = pNtk->vLtlProperties;
      if (pVVar7 == (Vec_Ptr_t *)0x0) goto LAB_00869040;
    }
    free(pVVar7);
    pNtk->vLtlProperties = (Vec_Ptr_t *)0x0;
  }
LAB_00869040:
  pVVar11 = pNtk->vObjPerm;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
      pNtk->vObjPerm->pArray = (int *)0x0;
      pVVar11 = pNtk->vObjPerm;
      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_00869088;
    }
    free(pVVar11);
    pNtk->vObjPerm = (Vec_Int_t *)0x0;
  }
LAB_00869088:
  pVVar11 = pNtk->vTopo;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
      pNtk->vTopo->pArray = (int *)0x0;
      pVVar11 = pNtk->vTopo;
      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_008690d0;
    }
    free(pVVar11);
    pNtk->vTopo = (Vec_Int_t *)0x0;
  }
LAB_008690d0:
  pVVar11 = pNtk->vFins;
  if (pVVar11 != (Vec_Int_t *)0x0) {
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
      pNtk->vFins->pArray = (int *)0x0;
      pVVar11 = pNtk->vFins;
      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_0086910d;
    }
    free(pVVar11);
  }
LAB_0086910d:
  free(pNtk);
  return;
}

Assistant:

void Abc_NtkDelete( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    void * pAttrMan;
    int TotalMemory, i;
//    int LargePiece = (4 << ABC_NUM_STEPS);
    if ( pNtk == NULL )
        return;
    // free EXDC Ntk
    if ( pNtk->pExdc )
        Abc_NtkDelete( pNtk->pExdc );
    if ( pNtk->pExcare )
        Abc_NtkDelete( (Abc_Ntk_t *)pNtk->pExcare );
    // dereference the BDDs
    if ( Abc_NtkHasBdd(pNtk) )
    {
#ifdef ABC_USE_CUDD
        Abc_NtkForEachNode( pNtk, pObj, i )
            Cudd_RecursiveDeref( (DdManager *)pNtk->pManFunc, (DdNode *)pObj->pData );
#endif
    }
    // make sure all the marks are clean
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        // free large fanout arrays
//        if ( pNtk->pMmObj && pObj->vFanouts.nCap * 4 > LargePiece )
//            ABC_FREE( pObj->vFanouts.pArray );
        // these flags should be always zero
        // if this is not true, something is wrong somewhere
        assert( pObj->fMarkA == 0 );
        assert( pObj->fMarkB == 0 );
        assert( pObj->fMarkC == 0 );
    }
    // free the nodes
    if ( pNtk->pMmStep == NULL )
    {
        Abc_NtkForEachObj( pNtk, pObj, i )
        {
            ABC_FREE( pObj->vFanouts.pArray );
            ABC_FREE( pObj->vFanins.pArray );
        }
    }
    if ( pNtk->pMmObj == NULL )
    {
        Abc_NtkForEachObj( pNtk, pObj, i )
            ABC_FREE( pObj );
    }
        
    // free the arrays
    Vec_PtrFree( pNtk->vPios );
    Vec_PtrFree( pNtk->vPis );
    Vec_PtrFree( pNtk->vPos );
    Vec_PtrFree( pNtk->vCis );
    Vec_PtrFree( pNtk->vCos );
    Vec_PtrFree( pNtk->vObjs );
    Vec_PtrFree( pNtk->vBoxes );
    ABC_FREE( pNtk->vTravIds.pArray );
    if ( pNtk->vLevelsR ) Vec_IntFree( pNtk->vLevelsR );
    ABC_FREE( pNtk->pModel );
    ABC_FREE( pNtk->pSeqModel );
    if ( pNtk->vSeqModelVec )
        Vec_PtrFreeFree( pNtk->vSeqModelVec );
    TotalMemory  = 0;
    TotalMemory += pNtk->pMmObj? Mem_FixedReadMemUsage(pNtk->pMmObj)  : 0;
    TotalMemory += pNtk->pMmStep? Mem_StepReadMemUsage(pNtk->pMmStep) : 0;
//    fprintf( stdout, "The total memory allocated internally by the network = %0.2f MB.\n", ((double)TotalMemory)/(1<<20) );
    // free the storage 
    if ( pNtk->pMmObj )
        Mem_FixedStop( pNtk->pMmObj, 0 );
    if ( pNtk->pMmStep )
        Mem_StepStop ( pNtk->pMmStep, 0 );
    // name manager
    Nm_ManFree( pNtk->pManName );
    // free the timing manager
    if ( pNtk->pManTime )
        Abc_ManTimeStop( pNtk->pManTime );
    Vec_IntFreeP( &pNtk->vPhases );
    // start the functionality manager
    if ( Abc_NtkIsStrash(pNtk) )
        Abc_AigFree( (Abc_Aig_t *)pNtk->pManFunc );
    else if ( Abc_NtkHasSop(pNtk) || Abc_NtkHasBlifMv(pNtk) )
        Mem_FlexStop( (Mem_Flex_t *)pNtk->pManFunc, 0 );
#ifdef ABC_USE_CUDD
    else if ( Abc_NtkHasBdd(pNtk) )
        Extra_StopManager( (DdManager *)pNtk->pManFunc );
#endif
    else if ( Abc_NtkHasAig(pNtk) )
        { if ( pNtk->pManFunc ) Hop_ManStop( (Hop_Man_t *)pNtk->pManFunc ); }
    else if ( Abc_NtkHasMapping(pNtk) )
        pNtk->pManFunc = NULL;
    else if ( !Abc_NtkHasBlackbox(pNtk) )
        assert( 0 );
    // free the hierarchy
    if ( pNtk->pDesign )
    {
        Abc_DesFree( pNtk->pDesign, pNtk );
        pNtk->pDesign = NULL;
    }
//    if ( pNtk->pBlackBoxes ) 
//        Vec_IntFree( pNtk->pBlackBoxes );
    // free node attributes
    Vec_PtrForEachEntry( Abc_Obj_t *, pNtk->vAttrs, pAttrMan, i )
        if ( pAttrMan )
            Vec_AttFree( (Vec_Att_t *)pAttrMan, 1 );
    assert( pNtk->pSCLib == NULL );
    Vec_IntFreeP( &pNtk->vGates );
    Vec_PtrFree( pNtk->vAttrs );
    Vec_IntFreeP( &pNtk->vNameIds );
    ABC_FREE( pNtk->pWLoadUsed );
    ABC_FREE( pNtk->pName );
    ABC_FREE( pNtk->pSpec );
    ABC_FREE( pNtk->pLutTimes );
    if ( pNtk->vOnehots )
        Vec_VecFree( (Vec_Vec_t *)pNtk->vOnehots );
    Vec_PtrFreeP( &pNtk->vLtlProperties );
    Vec_IntFreeP( &pNtk->vObjPerm );
    Vec_IntFreeP( &pNtk->vTopo );
    Vec_IntFreeP( &pNtk->vFins );
    ABC_FREE( pNtk );
}